

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O2

void aluInitRenderer(ALCdevice *device,int hrtf_id,HrtfRequestMode hrtf_appreq,
                    HrtfRequestMode hrtf_userreq)

{
  intrusive_ptr<HrtfStore> *this;
  DistanceComp *this_00;
  pointer paVar1;
  pointer pSVar2;
  pointer pSVar3;
  BFormatDec *pBVar4;
  pointer pcVar5;
  pointer pbVar6;
  HrtfStore *Hrtf;
  ALCenum AVar7;
  LogLevel LVar8;
  undefined8 uVar9;
  undefined4 level;
  byte bVar10;
  bool bVar11;
  int iVar12;
  ALuint AVar13;
  ALuint AVar14;
  ulong uVar15;
  anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 *paVar16;
  long lVar17;
  code *pcVar18;
  uint *puVar19;
  ulong uVar20;
  char *pcVar21;
  uint uVar22;
  pointer pSVar23;
  anon_class_8_1_518f0f94 map_spkr;
  uint uVar24;
  size_t sVar25;
  ALuint *pAVar26;
  BFChannelConfig BVar27;
  ulong uVar28;
  char *pcVar29;
  char *pcVar30;
  pointer pAVar31;
  AmbDecConf *conf;
  pointer pbVar32;
  undefined1 *puVar33;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 *puVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  span<const_AngularPoint,_18446744073709551615UL> AmbiPoints;
  long lStackY_1b0;
  float (*local_190) [16];
  HrtfStorePtr old_hrtf;
  _Head_base<0UL,_FrontStablizer_*,_false> local_170;
  ALuint speakermap [16];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> modeopt
  ;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> stablizer;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> decopt;
  
  this = &device->mHrtf;
  old_hrtf.mPtr = (device->mHrtf).mPtr;
  (device->mHrtf).mPtr = (HrtfStore *)0x0;
  std::__uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>::reset
            ((__uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_> *)
             &device->mHrtfState,(pointer)0x0);
  modeopt.mHasValue = false;
  modeopt._1_7_ = 0;
  al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)&modeopt);
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
  (device->HrtfName)._M_string_length = 0;
  *(device->HrtfName)._M_dataplus._M_p = '\0';
  device->mRenderMode = Normal;
  if (device->FmtChans == DevFmtChannelsDefault) {
    bVar10 = device->IsHeadphones;
    if (device->Type != Loopback) {
      ConfigValueStr_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)speakermap,(device->DeviceName)._M_dataplus._M_p,(char *)0x0,"stereo-mode");
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional<true,_true>
                (&modeopt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)speakermap);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)speakermap);
      uVar9 = modeopt.field_1.mValue._M_dataplus._M_p;
      if (modeopt.mHasValue == true) {
        iVar12 = al::strcasecmp((char *)modeopt.field_1.mValue._M_dataplus._M_p,"headphones");
        if (iVar12 == 0) {
          bVar10 = 1;
        }
        else {
          iVar12 = al::strcasecmp((char *)uVar9,"speakers");
          if (iVar12 == 0) {
            bVar10 = 0;
          }
          else {
            iVar12 = al::strcasecmp((char *)uVar9,"auto");
            if ((iVar12 != 0) && (0 < (int)gLogLevel)) {
              fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-mode: %s\n",uVar9);
            }
          }
        }
      }
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(&modeopt);
    }
    if (hrtf_userreq == Hrtf_Enable) {
      device->HrtfStatus = 3;
LAB_00152798:
      if ((device->HrtfList).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (device->HrtfList).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        EnumerateHrtf_abi_cxx11_
                  ((vector<std::string> *)&modeopt,(device->DeviceName)._M_dataplus._M_p);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::_M_move_assign(&device->HrtfList,&modeopt);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                   *)&modeopt);
      }
      if (-1 < hrtf_id) {
        pbVar32 = (device->HrtfList).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(uint)hrtf_id <
            (ulong)((long)(device->HrtfList).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar32 >> 5)) {
          GetLoadedHrtf((string *)&modeopt,(char *)(pbVar32 + (uint)hrtf_id),
                        (ALuint)(device->DeviceName)._M_dataplus._M_p);
          if (modeopt._0_8_ != 0) {
            al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)&modeopt);
            std::__cxx11::string::_M_assign((string *)&device->HrtfName);
          }
          al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
        }
      }
      if (this->mPtr == (HrtfStore *)0x0) {
        pcVar5 = (device->DeviceName)._M_dataplus._M_p;
        pbVar6 = (device->HrtfList).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar32 = (device->HrtfList).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_al::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar32 != pbVar6;
            pbVar32 = pbVar32 + 1) {
          GetLoadedHrtf((string *)&modeopt,(char *)pbVar32,(ALuint)pcVar5);
          if (modeopt._0_8_ != 0) {
            al::intrusive_ptr<HrtfStore>::operator=(this,(intrusive_ptr<HrtfStore> *)&modeopt);
            std::__cxx11::string::_M_assign((string *)&device->HrtfName);
            al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
            break;
          }
          al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
        }
        if (this->mPtr == (HrtfStore *)0x0) {
          AVar7 = 5;
LAB_00152b5a:
          device->HrtfStatus = AVar7;
          goto LAB_00152b61;
        }
      }
      modeopt.mHasValue = false;
      modeopt._1_7_ = 0;
      al::intrusive_ptr<HrtfStore>::operator=(&old_hrtf,(intrusive_ptr<HrtfStore> *)&modeopt);
      al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
      if (((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev == '\0') &&
         (iVar12 = __cxa_guard_acquire(&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                        CornerElev), iVar12 != 0)) {
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev = 0x3f1d9014;
        __cxa_guard_release(&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev);
      }
      if (((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O == '\0') &&
         (iVar12 = __cxa_guard_acquire(&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                        AmbiPoints1O), iVar12 != 0)) {
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._0_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._4_4_ = 0xbf490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._8_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._12_4_ = 0xc016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._16_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._20_4_ = 0x3f490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._24_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._28_4_ = 0x4016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._32_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev ^ 0x80000000;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._36_4_ = 0xbf490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._44_4_ = 0xc016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._52_4_ = 0x3f490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._60_4_ = 0x4016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._40_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._32_4_;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._48_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._32_4_;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._56_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O._32_4_;
        __cxa_guard_release(&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O);
      }
      if (((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O == '\0') &&
         (iVar12 = __cxa_guard_acquire(&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::
                                        AmbiPoints2O), iVar12 != 0)) {
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._0_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev ^ 0x80000000;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._4_4_ = 0xbf490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._12_4_ = 0xc016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._16_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._20_4_ = 0xc016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._24_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._28_4_ = 0x4016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._32_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._36_4_ = 0x3f490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._44_4_ = 0x3f490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._52_4_ = 0x4016cbe4;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._56_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::CornerElev;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._60_8_ = 0xbf9a5bffbf490fdb
        ;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._68_8_ = 0x3f9a5bffbfc90fdb
        ;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._76_8_ = 0xbf9a5bff3fc90fdb
        ;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._84_8_ = 0x3f9a5bff3fc90fdb
        ;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._92_8_ = 0xbfc90fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._100_8_ = 0xbf9a5bff;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._108_8_ = 0xbff7c3b6;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._116_8_ = 0x3f9a5bff;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._124_8_ =
             0xbebacf6f3ff7c3b6;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._132_8_ =
             0x3ebacf6f40490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._140_4_ = 0x40490fdb;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._144_4_ = 0x3ebacf6f;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._148_4_ = 0;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._152_4_ = 0xbebacf6f;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._156_4_ = 0;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._8_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._0_4_;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._40_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._0_4_;
        (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._48_4_ =
             (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O._0_4_;
        __cxa_guard_release(&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O);
      }
      device->mRenderMode = Hrtf;
      ConfigValueStr_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)speakermap,(device->DeviceName)._M_dataplus._M_p,(char *)0x0,"hrtf-mode");
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional<true,_true>
                (&modeopt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)speakermap);
      uVar24 = 1;
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)speakermap);
      pcVar30 = (char *)modeopt.field_1.mValue._M_dataplus._M_p;
      if (modeopt.mHasValue == true) {
        iVar12 = al::strcasecmp((char *)modeopt.field_1.mValue._M_dataplus._M_p,"basic");
        if ((iVar12 == 0) || (iVar12 = al::strcasecmp(pcVar30,"ambi3"), iVar12 == 0)) {
          if ((int)gLogLevel < 1) {
            pcVar30 = "ambi2";
          }
          else {
            fprintf((FILE *)gLogFile,
                    "[ALSOFT] (EE) HRTF mode \"%s\" deprecated, substituting \"%s\"\n",pcVar30,
                    "ambi2");
            pcVar30 = "ambi2";
          }
        }
        puVar33 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::hrtf_modes;
        speakermap._0_8_ = pcVar30;
        bVar11 = __gnu_cxx::__ops::
                 _Iter_pred<(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::$_0>::operator()
                           ((_Iter_pred<(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::__0> *)
                            speakermap,
                            (HrtfModeEntry *)
                            (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::hrtf_modes);
        if (!bVar11) {
          puVar33 = (undefined1 *)0x189020;
          bVar11 = __gnu_cxx::__ops::
                   _Iter_pred<(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::$_0>::operator()
                             ((_Iter_pred<(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::__0> *
                              )speakermap,
                              (HrtfModeEntry *)
                              ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::hrtf_modes + 0x10
                              ));
          if (!bVar11) {
            puVar33 = (undefined1 *)0x189030;
            bVar11 = __gnu_cxx::__ops::
                     _Iter_pred<(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::$_0>::operator()
                               ((_Iter_pred<(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::__0>
                                 *)speakermap,
                                (HrtfModeEntry *)
                                ((anonymous_namespace)::InitHrtfPanning(ALCdevice*)::hrtf_modes +
                                0x20));
            if (!bVar11) {
              if (0 < (int)gLogLevel) {
                fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected hrtf-mode: %s\n",pcVar30);
              }
              goto LAB_00152a21;
            }
          }
        }
        uVar24 = *(uint *)(puVar33 + 0xc);
        device->mRenderMode = *(RenderMode *)(puVar33 + 8);
      }
LAB_00152a21:
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(&modeopt);
      if (2 < (int)gLogLevel) {
        if (uVar24 % 100 - 10 < 10) {
          pcVar30 = "th";
        }
        else {
          uVar22 = uVar24 % 10;
          if (uVar22 == 1) {
            pcVar30 = "st";
          }
          else if (uVar22 == 2) {
            pcVar30 = "nd";
          }
          else {
            pcVar30 = "th";
            if (uVar22 == 3) {
              pcVar30 = "rd";
            }
          }
        }
        pcVar29 = "";
        if (device->mRenderMode == Hrtf) {
          pcVar29 = "+ Full ";
        }
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) %u%s order %sHRTF rendering enabled, using \"%s\"\n"
                ,(ulong)uVar24,pcVar30,pcVar29,(device->HrtfName)._M_dataplus._M_p);
      }
      if (uVar24 < 2) {
        local_190 = (float (*) [16])(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiMatrix1O
        ;
        pAVar31 = (pointer)&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O;
        puVar34 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints1O;
        puVar33 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiOrderHFGain1O;
      }
      else {
        local_190 = (float (*) [16])(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiMatrix2O
        ;
        pAVar31 = (pointer)&(anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O;
        puVar34 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiPoints2O;
        puVar33 = (anonymous_namespace)::InitHrtfPanning(ALCdevice*)::AmbiOrderHFGain2O;
      }
      device->mAmbiOrder = uVar24;
      sVar25 = ((ulong)uVar24 + 1) * ((ulong)uVar24 + 1);
      for (lVar17 = 0; sVar25 - lVar17 != 0; lVar17 = lVar17 + 1) {
        (device->Dry).AmbiMap._M_elems[lVar17] =
             (BFChannelConfig)((ulong)AmbiIndex::FromACN._M_elems[lVar17] << 0x20 | 0x3f800000);
      }
      AVar14 = ALCdevice::channelsFromFmt(device);
      anon_unknown.dwarf_1ee2ad::AllocChannels(device,sVar25,(ulong)AVar14);
      Hrtf = this->mPtr;
      DirectHrtfState::Create((DirectHrtfState *)&modeopt,sVar25);
      AmbiPoints.mDataEnd = pAVar31;
      AmbiPoints.mData = (pointer)puVar34;
      DirectHrtfState::build
                ((DirectHrtfState *)modeopt._0_8_,Hrtf,AmbiPoints,local_190,
                 (span<const_float,_4UL>)puVar33);
      uVar9 = modeopt._0_8_;
      modeopt.mHasValue = false;
      modeopt._1_7_ = 0;
      std::__uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_>::reset
                ((__uniq_ptr_impl<DirectHrtfState,_std::default_delete<DirectHrtfState>_> *)
                 &device->mHrtfState,(pointer)uVar9);
      anon_unknown.dwarf_1ee2ad::InitNearFieldCtrl(device,Hrtf->field->distance,uVar24,true);
      std::unique_ptr<DirectHrtfState,_std::default_delete<DirectHrtfState>_>::~unique_ptr
                ((unique_ptr<DirectHrtfState,_std::default_delete<DirectHrtfState>_> *)&modeopt);
      pcVar18 = ALCdevice::ProcessHrtf;
    }
    else {
      if (hrtf_userreq == Hrtf_Default) {
        bVar10 = hrtf_appreq != Hrtf_Disable & bVar10;
        if ((hrtf_appreq == Hrtf_Enable) || (bVar10 != 0)) {
          device->HrtfStatus = (uint)bVar10 + (uint)bVar10 * 2 + 1;
          goto LAB_00152798;
        }
      }
      else if (hrtf_appreq == Hrtf_Enable) {
        AVar7 = 2;
        goto LAB_00152b5a;
      }
LAB_00152b61:
      modeopt.mHasValue = false;
      modeopt._1_7_ = 0;
      al::intrusive_ptr<HrtfStore>::operator=(&old_hrtf,(intrusive_ptr<HrtfStore> *)&modeopt);
      al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
      device->mRenderMode = Pairwise;
      if (device->Type != Loopback) {
        ConfigValueInt(&modeopt.mHasValue,(device->DeviceName)._M_dataplus._M_p,(char *)0x0);
        if ((modeopt.mHasValue != false) && (level = modeopt._4_4_, modeopt._4_4_ - 1 < 6)) {
          std::make_unique<bs2b>();
          uVar9 = modeopt._0_8_;
          modeopt.mHasValue = false;
          modeopt._1_7_ = 0;
          std::__uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>::reset
                    ((__uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_> *)&device->Bs2b,
                     (pointer)uVar9);
          std::unique_ptr<bs2b,_std::default_delete<bs2b>_>::~unique_ptr
                    ((unique_ptr<bs2b,_std::default_delete<bs2b>_> *)&modeopt);
          bs2b_set_params((device->Bs2b)._M_t.
                          super___uniq_ptr_impl<bs2b,_std::default_delete<bs2b>_>._M_t.
                          super__Tuple_impl<0UL,_bs2b_*,_std::default_delete<bs2b>_>.
                          super__Head_base<0UL,_bs2b_*,_false>._M_head_impl,level,device->Frequency)
          ;
          if (2 < (int)gLogLevel) {
            fwrite("[ALSOFT] (II) BS2B enabled\n",0x1b,1,(FILE *)gLogFile);
          }
          anon_unknown.dwarf_1ee2ad::InitPanning(device,false,false);
          pcVar18 = ALCdevice::ProcessBs2b;
          goto LAB_00152db3;
        }
      }
      ConfigValueStr_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)speakermap,(device->DeviceName)._M_dataplus._M_p,(char *)0x0,"stereo-encoding");
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional<true,_true>
                (&modeopt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)speakermap);
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)speakermap);
      uVar9 = modeopt.field_1.mValue._M_dataplus._M_p;
      if (modeopt.mHasValue == true) {
        iVar12 = al::strcasecmp((char *)modeopt.field_1.mValue._M_dataplus._M_p,"uhj");
        if (iVar12 == 0) {
          device->mRenderMode = Normal;
        }
        else {
          iVar12 = al::strcasecmp((char *)uVar9,"panpot");
          if ((iVar12 != 0) && (0 < (int)gLogLevel)) {
            fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected stereo-encoding: %s\n",uVar9);
          }
        }
      }
      al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional(&modeopt);
      if (device->mRenderMode == Normal) {
        std::make_unique<Uhj2Encoder>();
        uVar9 = modeopt._0_8_;
        modeopt.mHasValue = false;
        modeopt._1_7_ = 0;
        std::__uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>::reset
                  ((__uniq_ptr_impl<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_> *)
                   &device->Uhj_Encoder,(pointer)uVar9);
        std::unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_>::~unique_ptr
                  ((unique_ptr<Uhj2Encoder,_std::default_delete<Uhj2Encoder>_> *)&modeopt);
        if (2 < (int)gLogLevel) {
          fwrite("[ALSOFT] (II) UHJ enabled\n",0x1a,1,(FILE *)gLogFile);
        }
        device->mAmbiOrder = 1;
        for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
          BVar27.Index._0_1_ = AmbiIndex::FromFuMa._M_elems[lVar17];
          BVar27.Scale = 1.0 / AmbiScale::FromFuMa._M_elems[AmbiIndex::FromFuMa._M_elems[lVar17]];
          BVar27.Index._1_3_ = 0;
          (device->Dry).AmbiMap._M_elems[lVar17] = BVar27;
        }
        AVar14 = ALCdevice::channelsFromFmt(device);
        anon_unknown.dwarf_1ee2ad::AllocChannels(device,3,(ulong)AVar14);
        pcVar18 = ALCdevice::ProcessUhj;
      }
      else {
        if (2 < (int)gLogLevel) {
          fwrite("[ALSOFT] (II) Stereo rendering\n",0x1f,1,(FILE *)gLogFile);
        }
        anon_unknown.dwarf_1ee2ad::InitPanning(device,false,false);
        pcVar18 = ALCdevice::ProcessAmbiDec;
      }
    }
LAB_00152db3:
    device->PostProcess = (PostProc)pcVar18;
    *(undefined8 *)&device->field_0x6e98 = 0;
    goto LAB_00152dc2;
  }
  modeopt.mHasValue = false;
  modeopt._1_7_ = 0;
  al::intrusive_ptr<HrtfStore>::operator=(&old_hrtf,(intrusive_ptr<HrtfStore> *)&modeopt);
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr((intrusive_ptr<HrtfStore> *)&modeopt);
  if (hrtf_appreq == Hrtf_Enable) {
    device->HrtfStatus = 5;
  }
  bVar11 = true;
  pcVar30 = (char *)0x0;
  switch(device->FmtChans) {
  case DevFmtQuad:
    pcVar30 = "quad";
    break;
  case DevFmtX51:
  case DevFmtX51Rear:
    pcVar30 = "surround51";
    break;
  case DevFmtX61:
    pcVar30 = "surround61";
    break;
  case DevFmtX71:
    pcVar30 = "surround71";
    break;
  default:
    goto switchD_00151fcf_caseD_6;
  }
  bVar11 = false;
switchD_00151fcf_caseD_6:
  pcVar29 = (device->DeviceName)._M_dataplus._M_p;
  modeopt._0_8_ = (long)&modeopt.field_1 + 8;
  modeopt.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  modeopt.field_1.mDummy[8] = '\0';
  modeopt.field_1._24_8_ = 0;
  if (bVar11) {
    conf = (AmbDecConf *)0x0;
  }
  else {
    ConfigValueStr_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stablizer,pcVar29,"decoder",pcVar30);
    al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional<true,_true>
              (&decopt,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&stablizer);
    al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&stablizer);
    if (decopt.mHasValue == true) {
      iVar12 = AmbDecConf::load((AmbDecConf *)&modeopt,
                                (char *)decopt.field_1.mValue._M_dataplus._M_p);
      if (iVar12 == 0) {
        if ((int)gLogLevel < 1) goto LAB_0015214e;
        fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Failed to load layout file %s\n",
                decopt.field_1.mValue._M_dataplus._M_p);
        conf = (AmbDecConf *)0x0;
      }
      else {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((uint)modeopt.field_1._28_4_ < 0x10000) {
          pAVar26 = speakermap;
          for (; __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &__lhs[2].field_2) {
            bVar11 = std::operator==(__lhs,"LF");
            if (bVar11) {
              lStackY_1b0 = 0;
LAB_00152e7c:
              AVar14 = (device->RealOut).ChannelIndex._M_elems[lStackY_1b0];
              if (AVar14 == 0xffffffff) {
                pcVar30 = "[ALSOFT] (EE) Failed to lookup AmbDec speaker label %s\n";
                goto joined_r0x00152f15;
              }
            }
            else {
              bVar11 = std::operator==(__lhs,"RF");
              lStackY_1b0 = 1;
              if (bVar11) goto LAB_00152e7c;
              bVar11 = std::operator==(__lhs,"CE");
              lStackY_1b0 = 2;
              if (bVar11) goto LAB_00152e7c;
              bVar11 = std::operator==(__lhs,"LS");
              if (bVar11) {
                bVar11 = device->FmtChans != DevFmtX51Rear;
LAB_00152e4e:
                lStackY_1b0 = (ulong)bVar11 * 3 + 4;
                goto LAB_00152e7c;
              }
              bVar11 = std::operator==(__lhs,"RS");
              if (bVar11) {
                bVar11 = device->FmtChans != DevFmtX51Rear;
LAB_00152e74:
                lStackY_1b0 = (ulong)bVar11 * 3 + 5;
                goto LAB_00152e7c;
              }
              bVar11 = std::operator==(__lhs,"LB");
              if (bVar11) {
                bVar11 = device->FmtChans == DevFmtX51;
                goto LAB_00152e4e;
              }
              bVar11 = std::operator==(__lhs,"RB");
              if (bVar11) {
                bVar11 = device->FmtChans == DevFmtX51;
                goto LAB_00152e74;
              }
              bVar11 = std::operator==(__lhs,"CB");
              lStackY_1b0 = 6;
              if (bVar11) goto LAB_00152e7c;
              pcVar30 = "[ALSOFT] (EE) AmbDec speaker label \"%s\" not recognized\n";
              AVar14 = 0xffffffff;
joined_r0x00152f15:
              if (0 < (int)gLogLevel) {
                fprintf((FILE *)gLogFile,pcVar30,(__lhs->_M_dataplus)._M_p);
                AVar14 = 0xffffffff;
              }
            }
            *pAVar26 = AVar14;
            pAVar26 = pAVar26 + 1;
          }
          stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>
          ._M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
          super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl._0_4_ = 0xffffffff;
          puVar19 = std::
                    __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                              (speakermap);
          conf = (AmbDecConf *)0x0;
          if (puVar19 == speakermap) {
            conf = (AmbDecConf *)&modeopt;
          }
        }
        else {
          if ((int)gLogLevel < 1) goto LAB_0015214e;
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unsupported channel mask 0x%04x (max 0x%x)\n");
          conf = (AmbDecConf *)0x0;
        }
      }
    }
    else {
LAB_0015214e:
      conf = (AmbDecConf *)0x0;
    }
    al::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional(&decopt);
  }
  if ((((device->RealOut).ChannelIndex._M_elems[2] == 0xffffffff) ||
      ((device->RealOut).ChannelIndex._M_elems[0] == 0xffffffff)) ||
     ((device->RealOut).ChannelIndex._M_elems[1] == 0xffffffff)) {
    bVar11 = false;
  }
  else {
    iVar12 = GetConfigValueBool(pcVar29,(char *)0x0,"front-stablizer",0);
    bVar11 = iVar12 != 0;
  }
  iVar12 = GetConfigValueBool(pcVar29,"decoder","hq-mode",1);
  if (conf == (AmbDecConf *)0x0) {
    anon_unknown.dwarf_1ee2ad::InitPanning(device,iVar12 != 0,bVar11);
  }
  else {
    if (((iVar12 == 0) && (conf->FreqBands != 1)) && (0 < (int)gLogLevel)) {
      fprintf((FILE *)gLogFile,
              "[ALSOFT] (EE) Basic renderer uses the high-frequency matrix as single-band (xover_freq = %.0fhz)\n"
              ,SUB84((double)conf->XOverFreq,0));
    }
    uVar24 = conf->ChanMask;
    AVar14 = 3;
    if (uVar24 < 0x200) {
      AVar14 = 2 - (uVar24 < 0x10);
    }
    device->mAmbiOrder = AVar14;
    if ((uVar24 & 0xfe7ce4) == 0) {
      sVar25 = (size_t)(AVar14 * 2 + 1);
      for (uVar15 = 0; sVar25 != uVar15; uVar15 = uVar15 + 1) {
        (device->Dry).AmbiMap._M_elems[uVar15] =
             (BFChannelConfig)((ulong)AmbiIndex::From2D._M_elems[uVar15] << 0x20 | 0x3f800000);
      }
    }
    else {
      sVar25 = (ulong)(AVar14 + 1) * (ulong)(AVar14 + 1);
      for (lVar17 = 0; sVar25 - lVar17 != 0; lVar17 = lVar17 + 1) {
        (device->Dry).AmbiMap._M_elems[lVar17] =
             (BFChannelConfig)((ulong)AmbiIndex::FromACN._M_elems[lVar17] << 0x20 | 0x3f800000);
      }
    }
    AVar13 = ALCdevice::channelsFromFmt(device);
    anon_unknown.dwarf_1ee2ad::AllocChannels(device,sVar25,(ulong)AVar13);
    stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
    super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
    super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
         (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
         (__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>)0x0;
    if (bVar11 == false) {
LAB_00152358:
      if (2 < (int)gLogLevel) {
        if (iVar12 == 0) {
          pcVar30 = "single";
        }
        else {
          pcVar30 = "dual";
          if (conf->FreqBands == 1) {
            pcVar30 = "single";
          }
        }
        uVar24 = conf->ChanMask;
        pcVar29 = "first";
        if (0xf < uVar24) {
          pcVar29 = "second";
        }
        pcVar21 = "third";
        if (uVar24 < 0x200) {
          pcVar21 = pcVar29;
        }
        pcVar29 = " periphonic";
        if ((uVar24 & 0xfe7ce4) == 0) {
          pcVar29 = "";
        }
        fprintf((FILE *)gLogFile,"[ALSOFT] (II) Enabling %s-band %s-order%s ambisonic decoder\n",
                pcVar30,pcVar21,pcVar29);
      }
    }
    else {
      uVar15 = ((long)(conf->Speakers).
                      super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(conf->Speakers).
                     super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x50;
      for (uVar20 = 0;
          (uVar28 = uVar15, uVar15 != uVar20 && (uVar28 = uVar20, speakermap[uVar20] != 2));
          uVar20 = uVar20 + 1) {
      }
      paVar1 = (conf->LFMatrix).
               super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar28 < (ulong)((long)(conf->LFMatrix).
                                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 6)) {
        bVar11 = false;
        for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 4) {
          bVar11 = (bool)(bVar11 | *(float *)((long)paVar1[uVar28]._M_elems + lVar17) != 0.0);
        }
        if (!bVar11) goto LAB_0015230f;
      }
      else {
        bVar11 = false;
LAB_0015230f:
        paVar1 = (conf->HFMatrix).
                 super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar28 < (ulong)((long)(conf->HFMatrix).
                                   super__Vector_base<std::array<float,_16UL>,_al::allocator<std::array<float,_16UL>,_4UL>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1 >> 6))
        {
          for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 4) {
            bVar11 = (bool)(bVar11 | *(float *)((long)paVar1[uVar28]._M_elems + lVar17) != 0.0);
          }
        }
      }
      if (bVar11) goto LAB_00152358;
      AVar13 = ALCdevice::channelsFromFmt(device);
      anon_unknown.dwarf_1ee2ad::CreateStablizer((size_t)&decopt,AVar13);
      uVar9 = decopt._0_8_;
      decopt.mHasValue = false;
      decopt._1_7_ = 0;
      std::__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>::reset
                ((__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&stablizer
                 ,(pointer)uVar9);
      std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
                ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&decopt);
      if (2 < (int)gLogLevel) {
        fwrite("[ALSOFT] (II) Front stablizer enabled\n",0x26,1,(FILE *)gLogFile);
        goto LAB_00152358;
      }
    }
    local_170._M_head_impl =
         (FrontStablizer *)
         stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>.
         _M_t.super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
         super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl;
    stablizer._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
    super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
    super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl =
         (__uniq_ptr_data<FrontStablizer,_std::default_delete<FrontStablizer>,_true,_true>)
         (__uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>)0x0;
    BFormatDec::Create((BFormatDec *)&decopt,conf,iVar12 != 0,sVar25,device->Frequency,&speakermap,
                       (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)
                       &local_170);
    uVar9 = decopt._0_8_;
    decopt.mHasValue = false;
    decopt._1_7_ = 0;
    std::__uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>::reset
              ((__uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_> *)&device->AmbiDecoder
               ,(pointer)uVar9);
    std::unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_>::~unique_ptr
              ((unique_ptr<BFormatDec,_std::default_delete<BFormatDec>_> *)&decopt);
    std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr
              ((unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> *)&local_170);
    pSVar3 = (conf->Speakers).
             super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    fVar35 = 0.0;
    pSVar2 = (conf->Speakers).
             super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pSVar23 = pSVar2; pSVar23 != pSVar3; pSVar23 = pSVar23 + 1) {
      fVar35 = fVar35 + pSVar23->Distance;
    }
    anon_unknown.dwarf_1ee2ad::InitNearFieldCtrl
              (device,fVar35 / (float)(ulong)(((long)pSVar3 - (long)pSVar2) / 0x50),AVar14,
               (conf->ChanMask & 0xfe7ce4) != 0);
    decopt._0_8_ = maxf;
    decopt.field_1.mValue._M_dataplus._M_p = (_Alloc_hider)(pointer)0x20;
    fVar35 = std::
             accumulate<__gnu_cxx::__normal_iterator<AmbDecConf::SpeakerConf_const*,std::vector<AmbDecConf::SpeakerConf,al::allocator<AmbDecConf::SpeakerConf,8ul>>>,float,std::_Bind<float(*(std::_Placeholder<1>,std::_Bind<std::_Mem_fn<float_AmbDecConf::SpeakerConf::*>(std::_Placeholder<2>)>))(float,float)>>
                       ((conf->Speakers).
                        super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (conf->Speakers).
                        super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                        ._M_impl.super__Vector_impl_data._M_finish,0.0,
                        (_Bind<float_(*(std::_Placeholder<1>,_std::_Bind<std::_Mem_fn<float_AmbDecConf::SpeakerConf::*>_(std::_Placeholder<2>)>))(float,_float)>
                         *)&decopt);
    iVar12 = GetConfigValueBool((device->DeviceName)._M_dataplus._M_p,"decoder","distance-comp",1);
    if ((0.0 < fVar35) && (iVar12 != 0)) {
      uVar24 = device->Frequency;
      this_00 = &device->ChannelDelay;
      lVar17 = 8;
      sVar25 = 0;
      for (uVar15 = 0;
          pSVar2 = (conf->Speakers).
                   super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar15 < (ulong)(((long)(conf->Speakers).
                                  super__Vector_base<AmbDecConf::SpeakerConf,_al::allocator<AmbDecConf::SpeakerConf,_8UL>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x50)
          ; uVar15 = uVar15 + 1) {
        uVar20 = (ulong)speakermap[uVar15];
        fVar38 = *(float *)((long)&(pSVar2->Name)._M_dataplus._M_p + lVar17 * 4);
        fVar36 = floorf((fVar35 - fVar38) * ((float)uVar24 / 343.3) + 0.5);
        fVar37 = fVar36;
        if ((1023.0 < fVar36) && (fVar37 = 1023.0, 0 < (int)gLogLevel)) {
          fprintf((FILE *)gLogFile,
                  "[ALSOFT] (EE) Delay for speaker \"%s\" exceeds buffer length (%f > %d)\n",
                  SUB84((double)fVar36,0),*(undefined8 *)((long)pSVar2 + lVar17 * 4 + -0x20),0x3ff);
          fVar38 = *(float *)((long)&(pSVar2->Name)._M_dataplus._M_p + lVar17 * 4);
          fVar37 = 1023.0;
        }
        LVar8 = gLogLevel;
        uVar28 = (ulong)fVar37;
        (device->ChannelDelay).mChannels._M_elems[uVar20].Length = (ALuint)uVar28;
        (this_00->mChannels)._M_elems[uVar20].Gain = fVar38 / fVar35;
        if (2 < (int)LVar8) {
          fprintf((FILE *)gLogFile,
                  "[ALSOFT] (II) Channel %u \"%s\" distance compensation: %u samples, %f gain\n",
                  SUB84((double)(fVar38 / fVar35),0),uVar20,
                  *(undefined8 *)((long)pSVar2 + lVar17 * 4 + -0x20));
          uVar28 = (ulong)(this_00->mChannels)._M_elems[uVar20].Length;
        }
        sVar25 = sVar25 + ((uVar28 & 0xffffffff) + 3 & 0x1fffffffc);
        lVar17 = lVar17 + 0x14;
      }
      if (sVar25 != 0) {
        DistanceComp::setSampleCount(this_00,sVar25);
        uVar15._0_4_ = (device->ChannelDelay).mChannels._M_elems[0].Gain;
        uVar15._4_4_ = (device->ChannelDelay).mChannels._M_elems[0].Length;
        paVar16 = &((device->ChannelDelay).mSamples._M_t.
                    super___uniq_ptr_impl<al::FlexArray<float,_16UL>,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_al::FlexArray<float,_16UL>_*,_std::default_delete<al::FlexArray<float,_16UL>_>_>
                    .super__Head_base<0UL,_al::FlexArray<float,_16UL>_*,_false>._M_head_impl)->
                   field_1;
        (device->ChannelDelay).mChannels._M_elems[0].Buffer = (float *)paVar16;
        for (lVar17 = 0; lVar17 != 0xf0; lVar17 = lVar17 + 0x10) {
          uVar20 = uVar15 >> 0x20;
          uVar15 = *(ulong *)((long)&(device->ChannelDelay).mChannels._M_elems[1].Gain + lVar17);
          paVar16 = (anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 *)
                    (paVar16->mArray + (uVar20 + 3 & 0x1fffffffc));
          *(anon_union_16_2_dde17770_for_FlexArray<float,_16UL>_3 **)
           ((long)&(device->ChannelDelay).mChannels._M_elems[1].Buffer + lVar17) = paVar16;
        }
      }
    }
    std::unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>::~unique_ptr(&stablizer);
  }
  pBVar4 = (device->AmbiDecoder)._M_t.
           super___uniq_ptr_impl<BFormatDec,_std::default_delete<BFormatDec>_>._M_t.
           super__Tuple_impl<0UL,_BFormatDec_*,_std::default_delete<BFormatDec>_>.
           super__Head_base<0UL,_BFormatDec_*,_false>._M_head_impl;
  if (pBVar4 != (BFormatDec *)0x0) {
    if ((_Head_base<0UL,_FrontStablizer_*,_false>)
        *(_Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_> *)
         &(pBVar4->mStablizer)._M_t.
          super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_> ==
        (FrontStablizer *)0x0) {
      pcVar18 = ALCdevice::ProcessAmbiDec;
    }
    else {
      pcVar18 = ALCdevice::ProcessAmbiDecStablized;
    }
    device->PostProcess = (PostProc)pcVar18;
    *(undefined8 *)&device->field_0x6e98 = 0;
  }
  AmbDecConf::~AmbDecConf((AmbDecConf *)&modeopt);
LAB_00152dc2:
  al::intrusive_ptr<HrtfStore>::~intrusive_ptr(&old_hrtf);
  return;
}

Assistant:

void aluInitRenderer(ALCdevice *device, int hrtf_id, HrtfRequestMode hrtf_appreq,
    HrtfRequestMode hrtf_userreq)
{
    /* Hold the HRTF the device last used, in case it's used again. */
    HrtfStorePtr old_hrtf{std::move(device->mHrtf)};

    device->mHrtfState = nullptr;
    device->mHrtf = nullptr;
    device->HrtfName.clear();
    device->mRenderMode = RenderMode::Normal;

    if(device->FmtChans != DevFmtStereo)
    {
        old_hrtf = nullptr;
        if(hrtf_appreq == Hrtf_Enable)
            device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

        const char *layout{nullptr};
        switch(device->FmtChans)
        {
            case DevFmtQuad: layout = "quad"; break;
            case DevFmtX51: /* fall-through */
            case DevFmtX51Rear: layout = "surround51"; break;
            case DevFmtX61: layout = "surround61"; break;
            case DevFmtX71: layout = "surround71"; break;
            /* Mono, Stereo, and Ambisonics output don't use custom decoders. */
            case DevFmtMono:
            case DevFmtStereo:
            case DevFmtAmbi3D:
                break;
        }

        const char *devname{device->DeviceName.c_str()};
        ALuint speakermap[MAX_OUTPUT_CHANNELS];
        AmbDecConf *pconf{nullptr};
        AmbDecConf conf{};
        if(layout)
        {
            if(auto decopt = ConfigValueStr(devname, "decoder", layout))
            {
                if(!conf.load(decopt->c_str()))
                    ERR("Failed to load layout file %s\n", decopt->c_str());
                else if(conf.Speakers.size() > MAX_OUTPUT_CHANNELS)
                    ERR("Unsupported speaker count %zu (max %d)\n", conf.Speakers.size(),
                        MAX_OUTPUT_CHANNELS);
                else if(conf.ChanMask > AMBI_3ORDER_MASK)
                    ERR("Unsupported channel mask 0x%04x (max 0x%x)\n", conf.ChanMask,
                        AMBI_3ORDER_MASK);
                else if(MakeSpeakerMap(device, &conf, speakermap))
                    pconf = &conf;
            }
        }

        /* Enable the stablizer only for formats that have front-left, front-
         * right, and front-center outputs.
         */
        const bool stablize{device->RealOut.ChannelIndex[FrontCenter] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontLeft] != INVALID_CHANNEL_INDEX
            && device->RealOut.ChannelIndex[FrontRight] != INVALID_CHANNEL_INDEX
            && GetConfigValueBool(devname, nullptr, "front-stablizer", 0) != 0};
        const bool hqdec{GetConfigValueBool(devname, "decoder", "hq-mode", 1) != 0};
        if(!pconf)
            InitPanning(device, hqdec, stablize);
        else
            InitCustomPanning(device, hqdec, stablize, pconf, speakermap);
        if(auto *ambidec{device->AmbiDecoder.get()})
        {
            device->PostProcess = ambidec->hasStablizer() ? &ALCdevice::ProcessAmbiDecStablized
                : &ALCdevice::ProcessAmbiDec;
        }
        return;
    }

    bool headphones{device->IsHeadphones};
    if(device->Type != DeviceType::Loopback)
    {
        if(auto modeopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-mode"))
        {
            const char *mode{modeopt->c_str()};
            if(al::strcasecmp(mode, "headphones") == 0)
                headphones = true;
            else if(al::strcasecmp(mode, "speakers") == 0)
                headphones = false;
            else if(al::strcasecmp(mode, "auto") != 0)
                ERR("Unexpected stereo-mode: %s\n", mode);
        }
    }

    if(hrtf_userreq == Hrtf_Default)
    {
        bool usehrtf = (headphones && hrtf_appreq != Hrtf_Disable) ||
                       (hrtf_appreq == Hrtf_Enable);
        if(!usehrtf) goto no_hrtf;

        device->HrtfStatus = ALC_HRTF_ENABLED_SOFT;
        if(headphones && hrtf_appreq != Hrtf_Disable)
            device->HrtfStatus = ALC_HRTF_HEADPHONES_DETECTED_SOFT;
    }
    else
    {
        if(hrtf_userreq != Hrtf_Enable)
        {
            if(hrtf_appreq == Hrtf_Enable)
                device->HrtfStatus = ALC_HRTF_DENIED_SOFT;
            goto no_hrtf;
        }
        device->HrtfStatus = ALC_HRTF_REQUIRED_SOFT;
    }

    if(device->HrtfList.empty())
        device->HrtfList = EnumerateHrtf(device->DeviceName.c_str());

    if(hrtf_id >= 0 && static_cast<ALuint>(hrtf_id) < device->HrtfList.size())
    {
        const char *devname{device->DeviceName.c_str()};
        const std::string &hrtfname = device->HrtfList[static_cast<ALuint>(hrtf_id)];
        if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
        {
            device->mHrtf = std::move(hrtf);
            device->HrtfName = hrtfname;
        }
    }

    if(!device->mHrtf)
    {
        const char *devname{device->DeviceName.c_str()};
        for(const auto &hrtfname : device->HrtfList)
        {
            if(HrtfStorePtr hrtf{GetLoadedHrtf(hrtfname, devname, device->Frequency)})
            {
                device->mHrtf = std::move(hrtf);
                device->HrtfName = hrtfname;
                break;
            }
        }
    }

    if(device->mHrtf)
    {
        old_hrtf = nullptr;

        InitHrtfPanning(device);
        device->PostProcess = &ALCdevice::ProcessHrtf;
        return;
    }
    device->HrtfStatus = ALC_HRTF_UNSUPPORTED_FORMAT_SOFT;

no_hrtf:
    old_hrtf = nullptr;

    device->mRenderMode = RenderMode::Pairwise;

    if(device->Type != DeviceType::Loopback)
    {
        if(auto cflevopt = ConfigValueInt(device->DeviceName.c_str(), nullptr, "cf_level"))
        {
            if(*cflevopt > 0 && *cflevopt <= 6)
            {
                device->Bs2b = std::make_unique<bs2b>();
                bs2b_set_params(device->Bs2b.get(), *cflevopt,
                    static_cast<int>(device->Frequency));
                TRACE("BS2B enabled\n");
                InitPanning(device);
                device->PostProcess = &ALCdevice::ProcessBs2b;
                return;
            }
        }
    }

    if(auto encopt = ConfigValueStr(device->DeviceName.c_str(), nullptr, "stereo-encoding"))
    {
        const char *mode{encopt->c_str()};
        if(al::strcasecmp(mode, "uhj") == 0)
            device->mRenderMode = RenderMode::Normal;
        else if(al::strcasecmp(mode, "panpot") != 0)
            ERR("Unexpected stereo-encoding: %s\n", mode);
    }
    if(device->mRenderMode == RenderMode::Normal)
    {
        device->Uhj_Encoder = std::make_unique<Uhj2Encoder>();
        TRACE("UHJ enabled\n");
        InitUhjPanning(device);
        device->PostProcess = &ALCdevice::ProcessUhj;
        return;
    }

    TRACE("Stereo rendering\n");
    InitPanning(device);
    device->PostProcess = &ALCdevice::ProcessAmbiDec;
}